

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O1

bool __thiscall
cmCMakePresetsGraph::ReadProjectPresetsInternal(cmCMakePresetsGraph *this,bool allowNoFiles)

{
  cmJSONState *pcVar1;
  _Base_ptr *pp_Var2;
  _Base_ptr *pp_Var3;
  _Base_ptr *pp_Var4;
  _Rb_tree_color _Var5;
  _Base_ptr p_Var6;
  bool bVar7;
  bool bVar8;
  char cVar9;
  ExpandMacroResult EVar10;
  uint uVar11;
  int iVar12;
  mapped_type *pmVar13;
  _Rb_tree_node_base *p_Var14;
  undefined7 extraout_var;
  _Base_ptr p_Var15;
  _Base_ptr p_Var16;
  iterator iVar17;
  size_type sVar18;
  _Rb_tree_node_base *p_Var19;
  reference pvVar20;
  _Rb_tree_node_base *extraout_RAX;
  _Rb_tree_node_base *extraout_RAX_00;
  _Rb_tree_node_base *extraout_RAX_01;
  _Rb_tree_node_base *extraout_RAX_02;
  ulong uVar21;
  const_iterator cVar22;
  const_iterator cVar23;
  const_iterator cVar24;
  const_iterator cVar25;
  _Base_ptr p_Var26;
  _Rb_tree_node_base *p_Var27;
  cmCMakePresetsGraph *pcVar28;
  cmJSONState *__return_storage_ptr__;
  cmJSONState *pcVar29;
  cmJSONState *__x;
  _Link_type p_Var30;
  WorkflowStep *step;
  _Rb_tree_header *p_Var31;
  undefined4 uVar32;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *target;
  ulong uVar33;
  bool bVar34;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
  envCycles;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
  cycleStatus;
  string installDir;
  vector<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_> inProgressFiles;
  string binaryDir;
  string filename;
  File *file;
  ulong local_230;
  ulong local_228;
  undefined1 local_208 [40];
  size_t local_1e0;
  undefined1 local_1d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  Error *local_1b8;
  pointer local_1b0;
  _Alloc_hider local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  undefined1 local_188 [24];
  Error local_170;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
  *local_148;
  _Base_ptr local_140;
  string local_138;
  cmJSONState local_118;
  _Base_ptr local_c8;
  string local_c0;
  string local_a0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>_>_>
  *local_80;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>_>
  *local_78;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>_>
  *local_70;
  _Rb_tree_node_base *local_68;
  string *local_60;
  File *local_58;
  string local_50;
  
  local_1d8._8_8_ = (this->SourceDir)._M_dataplus._M_p;
  local_1d8._0_8_ = (this->SourceDir)._M_string_length;
  local_1c8._M_allocated_capacity = 0;
  local_1c8._8_8_ = (Error *)0x16;
  local_1b8 = (Error *)0x81a37c;
  local_1b0 = (pointer)0x0;
  views._M_len = 2;
  views._M_array = (iterator)local_1d8;
  cmCatViews(&local_a0,views);
  local_118.doc._M_dataplus._M_p = (pointer)0x0;
  local_118.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar7 = cmsys::SystemTools::FileExists(&local_a0);
  if (bVar7) {
    bVar7 = ReadJSONFile(this,&local_a0,User,Root,
                         (vector<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>
                          *)&local_118.errors.
                             super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>
                             ._M_impl.super__Vector_impl_data._M_finish,&local_58,&this->errors);
LAB_003ce786:
    bVar8 = true;
    if (bVar7 != false) goto LAB_003ce793;
  }
  else {
    local_1d8._8_8_ = (this->SourceDir)._M_dataplus._M_p;
    local_1d8._0_8_ = (this->SourceDir)._M_string_length;
    local_1c8._M_allocated_capacity = 0;
    local_1c8._8_8_ = (Error *)0x12;
    local_1b8 = (Error *)0x81a369;
    local_1b0 = (pointer)0x0;
    views_00._M_len = 2;
    views_00._M_array = (iterator)local_1d8;
    cmCatViews((string *)local_188,views_00);
    std::__cxx11::string::operator=((string *)&local_a0,(string *)local_188);
    if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
      operator_delete((void *)local_188._0_8_,(ulong)(local_188._16_8_ + 1));
    }
    bVar7 = cmsys::SystemTools::FileExists(&local_a0);
    if (bVar7) {
      bVar7 = ReadJSONFile(this,&local_a0,Project,Root,
                           (vector<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>
                            *)&local_118.errors.
                               super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>
                               ._M_impl.super__Vector_impl_data._M_finish,&local_58,&this->errors);
      goto LAB_003ce786;
    }
    bVar8 = false;
LAB_003ce793:
    if (local_118.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_118.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      __assert_fail("inProgressFiles.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCMakePresetsGraph.cxx"
                    ,0x433,"bool cmCMakePresetsGraph::ReadProjectPresetsInternal(bool)");
    }
    if (bVar8) {
      local_148 = &this->ConfigurePresets;
      bVar7 = anon_unknown.dwarf_153d5c5::
              ComputePresetInheritance<cmCMakePresetsGraph::ConfigurePreset>(local_148,this);
      if ((bVar7) &&
         (pcVar28 = this,
         bVar7 = anon_unknown.dwarf_153d5c5::
                 ComputePresetInheritance<cmCMakePresetsGraph::ConfigurePreset>(local_148,this),
         bVar7)) {
        local_1c8._8_8_ = local_1d8 + 8;
        local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffff00000000;
        local_1c8._M_allocated_capacity = 0;
        local_1b0 = (pointer)0x0;
        p_Var14 = (this->BuildPresets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var31 = &(this->BuildPresets)._M_t._M_impl.super__Rb_tree_header;
        local_1b8 = (Error *)local_1c8._8_8_;
        if ((_Rb_tree_header *)p_Var14 != p_Var31) {
          do {
            pcVar28 = (cmCMakePresetsGraph *)(p_Var14 + 1);
            pmVar13 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                                    *)local_1d8,(key_type *)pcVar28);
            *pmVar13 = Unvisited;
            p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
          } while ((_Rb_tree_header *)p_Var14 != p_Var31);
        }
        p_Var14 = (this->BuildPresets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        bVar7 = (_Rb_tree_header *)p_Var14 == p_Var31;
        if (!bVar7) {
          bVar7 = false;
          do {
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
            ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                   *)local_188,
                  (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                   *)local_1d8);
            pcVar28 = (cmCMakePresetsGraph *)&this->BuildPresets;
            bVar8 = anon_unknown.dwarf_153d5c5::VisitPreset<cmCMakePresetsGraph::BuildPreset>
                              ((BuildPreset *)(p_Var14 + 2),&this->BuildPresets,
                               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                                *)local_188,this);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
            ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                        *)local_188._16_8_,(_Link_type)pcVar28);
            if (!bVar8) break;
            p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
            bVar7 = (_Rb_tree_header *)p_Var14 == p_Var31;
          } while (!bVar7);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
        ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                    *)local_1c8._M_allocated_capacity,(_Link_type)pcVar28);
        if (bVar7) {
          local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffff00000000;
          local_1c8._M_allocated_capacity = 0;
          local_1c8._8_8_ = local_1d8 + 8;
          local_1b0 = (pointer)0x0;
          p_Var14 = (this->TestPresets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var31 = &(this->TestPresets)._M_t._M_impl.super__Rb_tree_header;
          local_1b8 = (Error *)local_1c8._8_8_;
          if ((_Rb_tree_header *)p_Var14 != p_Var31) {
            do {
              pcVar28 = (cmCMakePresetsGraph *)(p_Var14 + 1);
              pmVar13 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                                      *)local_1d8,(key_type *)pcVar28);
              *pmVar13 = Unvisited;
              p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
            } while ((_Rb_tree_header *)p_Var14 != p_Var31);
          }
          p_Var14 = (this->TestPresets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          bVar7 = (_Rb_tree_header *)p_Var14 == p_Var31;
          if (!bVar7) {
            bVar7 = false;
            do {
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
              ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                     *)local_188,
                    (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                     *)local_1d8);
              pcVar28 = (cmCMakePresetsGraph *)&this->TestPresets;
              bVar8 = anon_unknown.dwarf_153d5c5::VisitPreset<cmCMakePresetsGraph::TestPreset>
                                ((TestPreset *)(p_Var14 + 2),&this->TestPresets,
                                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                                  *)local_188,this);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
              ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                          *)local_188._16_8_,(_Link_type)pcVar28);
              if (!bVar8) break;
              p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
              bVar7 = (_Rb_tree_header *)p_Var14 == p_Var31;
            } while (!bVar7);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
          ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                      *)local_1c8._M_allocated_capacity,(_Link_type)pcVar28);
          if (bVar7) {
            bVar7 = anon_unknown.dwarf_153d5c5::
                    ComputePresetInheritance<cmCMakePresetsGraph::PackagePreset>
                              (&this->PackagePresets,this);
            if (!bVar7) goto LAB_003cea08;
            bVar7 = anon_unknown.dwarf_153d5c5::
                    ComputePresetInheritance<cmCMakePresetsGraph::WorkflowPreset>
                              (&this->WorkflowPresets,this);
            uVar11 = (uint)CONCAT71(extraout_var,bVar7);
            goto LAB_003cea0a;
          }
        }
        uVar11 = 0;
      }
      else {
LAB_003cea08:
        uVar11 = 0;
      }
LAB_003cea0a:
      if ((char)uVar11 != '\0') {
        p_Var16 = (this->ConfigurePresets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_140 = &(this->ConfigurePresets)._M_t._M_impl.super__Rb_tree_header._M_header;
        local_198._12_4_ = uVar11;
        if (p_Var16 != local_140) {
          pcVar1 = &this->parseState;
          do {
            pp_Var3 = &p_Var16[0x13]._M_right;
            std::optional<cmCMakePresetsGraph::ConfigurePreset>::
            emplace<cmCMakePresetsGraph::ConfigurePreset_const&>
                      ((optional<cmCMakePresetsGraph::ConfigurePreset> *)pp_Var3,
                       (ConfigurePreset *)(p_Var16 + 2));
            local_208._8_4_ = _S_red;
            local_208._16_8_ = (_Base_ptr)0x0;
            local_208._24_8_ = local_208 + 8;
            local_1e0 = 0;
            pp_Var4 = &p_Var16[0x19]._M_parent;
            local_208._32_8_ = local_208._24_8_;
            for (p_Var14 = p_Var16[0x19]._M_right; p_Var14 != (_Rb_tree_node_base *)pp_Var4;
                p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14)) {
              pmVar13 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                                      *)local_208,(key_type *)(p_Var14 + 1));
              *pmVar13 = Unvisited;
            }
            local_118.parseStack.
            super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_118.parseStack.
            super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_118.parseStack.
            super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_1d8._0_8_ = operator_new(0x38);
            ((MacroExpander *)local_1d8._0_8_)->_vptr_MacroExpander =
                 (_func_int **)&PTR_operator___00a56870;
            ((MacroExpander *)(local_1d8._0_8_ + 8))->_vptr_MacroExpander = (_func_int **)this;
            *(undefined1 *)&((MacroExpander *)(local_1d8._0_8_ + 0x30))->_vptr_MacroExpander = 0;
            std::
            vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
            ::
            emplace_back<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>
                      ((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
                        *)&local_118,
                       (unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
                        *)local_1d8);
            if ((MacroExpander *)local_1d8._0_8_ != (MacroExpander *)0x0) {
              (*(*(_func_int ***)local_1d8._0_8_)[2])();
            }
            local_1d8._0_8_ = operator_new(0x18);
            ((MacroExpander *)local_1d8._0_8_)->_vptr_MacroExpander =
                 (_func_int **)&PTR_operator___00a56d50;
            ((MacroExpander *)(local_1d8._0_8_ + 8))->_vptr_MacroExpander = (_func_int **)this;
            ((MacroExpander *)(local_1d8._0_8_ + 0x10))->_vptr_MacroExpander =
                 (_func_int **)(p_Var16 + 2);
            __x = (cmJSONState *)local_1d8;
            std::
            vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
            ::
            emplace_back<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>
                      ((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
                        *)&local_118,
                       (unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
                        *)__x);
            if ((MacroExpander *)local_1d8._0_8_ != (MacroExpander *)0x0) {
              (*(*(_func_int ***)local_1d8._0_8_)[2])();
            }
            local_1d8._0_8_ = operator_new(0x20);
            *(undefined ***)local_1d8._0_8_ = &PTR_operator___00a56bd0;
            *(undefined1 **)(local_1d8._0_8_ + 8) = local_208;
            *(_Base_ptr **)(local_1d8._0_8_ + 0x10) = pp_Var3;
            *(cmJSONState **)(local_1d8._0_8_ + 0x18) = &local_118;
            std::
            vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
            ::
            emplace_back<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>
                      ((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
                        *)&local_118,
                       (unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
                        *)__x);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d8._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              (**(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_1d8._0_8_)->_M_allocated_capacity + 0x10))();
            }
            p_Var15 = p_Var16[0x19]._M_right;
            bVar7 = p_Var15 == (_Base_ptr)pp_Var4;
            p_Var14 = p_Var16;
            if (!bVar7) {
              bVar7 = false;
              do {
                bVar8 = true;
                if ((char)p_Var15[3]._M_color == _S_black) {
                  __x = (cmJSONState *)(p_Var15 + 1);
                  pmVar13 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                                          *)local_208,(key_type *)__x);
                  EVar10 = Ok;
                  if (*pmVar13 != Verified) {
                    if (*pmVar13 == InProgress) {
                      EVar10 = Error;
                    }
                    else {
                      _Var5 = p_Var16[4]._M_parent[1]._M_color;
                      *pmVar13 = InProgress;
                      __x = &local_118;
                      EVar10 = cmCMakePresetsGraphInternal::ExpandMacros
                                         ((string *)(p_Var15 + 2),(MacroExpanderVector *)__x,_Var5);
                      if (EVar10 == Ok) {
                        *pmVar13 = Verified;
                        EVar10 = Ok;
                      }
                    }
                  }
                  if (EVar10 == Ignore) {
                    p_Var14 = (_Rb_tree_node_base *)&DAT_00000001;
                    if (*(char *)&p_Var16[0x25]._M_left == '\x01') {
                      *(undefined1 *)&p_Var16[0x25]._M_left = 0;
                      ConfigurePreset::~ConfigurePreset((ConfigurePreset *)pp_Var3);
                    }
                    bVar8 = false;
                  }
                  else if (EVar10 == Error) {
                    __x = pcVar1;
                    cmCMakePresetsErrors::INVALID_PRESET_NAMED
                              ((string *)&p_Var16[2]._M_parent,pcVar1);
                    bVar8 = false;
                    p_Var14 = (_Rb_tree_node_base *)0x0;
                  }
                }
                if (!bVar8) break;
                p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
                bVar7 = p_Var15 == (_Base_ptr)pp_Var4;
              } while (!bVar7);
            }
            if (bVar7) {
              p_Var15 = p_Var16[6]._M_left;
              __return_storage_ptr__ = &local_118;
              if (p_Var15 != (_Base_ptr)0x0) {
                local_1d8[1] = 0;
                __x = __return_storage_ptr__;
                cVar9 = (**(code **)(*(long *)p_Var15 + 0x10))
                                  (p_Var15,__return_storage_ptr__,p_Var16[4]._M_parent[1]._M_color);
                if (cVar9 == '\0') {
                  __x = pcVar1;
                  cmCMakePresetsErrors::INVALID_PRESET_NAMED((string *)&p_Var16[2]._M_parent,pcVar1)
                  ;
                  bVar7 = false;
                  p_Var14 = (_Rb_tree_node_base *)0x0;
                }
                else if (local_1d8[1] == '\0') {
                  p_Var14 = (_Rb_tree_node_base *)&DAT_00000001;
                  if (*(char *)&p_Var16[0x25]._M_left == '\x01') {
                    *(undefined1 *)&p_Var16[0x25]._M_left = 0;
                    ConfigurePreset::~ConfigurePreset((ConfigurePreset *)pp_Var3);
                  }
                  bVar7 = false;
                }
                else {
                  *(byte *)&p_Var16[0x18]._M_right = local_1d8[0];
                  bVar7 = true;
                }
                if (!bVar7) goto LAB_003cf298;
              }
              local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_c0,p_Var16[0xd]._M_parent,
                         (long)&(p_Var16[0xd]._M_left)->_M_color + (long)p_Var16[0xd]._M_parent);
              __x = __return_storage_ptr__;
              EVar10 = cmCMakePresetsGraphInternal::ExpandMacros
                                 (&local_c0,(MacroExpanderVector *)__return_storage_ptr__,
                                  p_Var16[4]._M_parent[1]._M_color);
              if (EVar10 == Ignore) {
                p_Var14 = (_Rb_tree_node_base *)&DAT_00000001;
                if (*(char *)&p_Var16[0x25]._M_left == '\x01') {
                  *(undefined1 *)&p_Var16[0x25]._M_left = 0;
                  ConfigurePreset::~ConfigurePreset((ConfigurePreset *)pp_Var3);
                }
              }
              else if (EVar10 == Error) {
                p_Var14 = (_Rb_tree_node_base *)0x0;
              }
              else {
                if ((pointer)local_c0._M_string_length != (pointer)0x0) {
                  bVar7 = cmsys::SystemTools::FileIsFullPath(&local_c0);
                  if (!bVar7) {
                    local_1d8._8_8_ = (this->SourceDir)._M_dataplus._M_p;
                    local_1d8._0_8_ = (this->SourceDir)._M_string_length;
                    local_1c8._M_allocated_capacity = 0;
                    local_188._0_8_ = (pointer)0x0;
                    local_188._8_8_ = &DAT_00000001;
                    local_1b8 = &local_170;
                    local_170.location.line._0_1_ = '/';
                    local_1c8._8_8_ = &DAT_00000001;
                    local_1b0 = (pointer)0x0;
                    local_1a8._M_p = (pointer)local_c0._M_string_length;
                    local_1a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_c0._M_dataplus._M_p;
                    local_198._M_allocated_capacity = 0;
                    views_01._M_len = 3;
                    views_01._M_array = (iterator)local_1d8;
                    local_188._16_8_ = local_1b8;
                    cmCatViews(&local_138,views_01);
                    std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_138);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_138._M_dataplus._M_p != &local_138.field_2) {
                      operator_delete(local_138._M_dataplus._M_p,
                                      local_138.field_2._M_allocated_capacity + 1);
                    }
                  }
                  __x = (cmJSONState *)local_1d8;
                  cmsys::SystemTools::CollapseFullPath((string *)__x,&local_c0);
                  std::__cxx11::string::operator=((string *)(p_Var16 + 0x1f),(string *)__x);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1d8._0_8_ != &local_1c8) {
                    __x = (cmJSONState *)(local_1c8._M_allocated_capacity + 1);
                    operator_delete((void *)local_1d8._0_8_,(ulong)__x);
                  }
                  cmsys::SystemTools::ConvertToUnixSlashes((string *)(p_Var16 + 0x1f));
                }
                pcVar29 = __x;
                if (p_Var16[0xe]._M_left != (_Base_ptr)0x0) {
                  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_138,p_Var16[0xe]._M_parent,
                             (long)&(p_Var16[0xe]._M_left)->_M_color + (long)p_Var16[0xe]._M_parent)
                  ;
                  EVar10 = cmCMakePresetsGraphInternal::ExpandMacros
                                     (&local_138,(MacroExpanderVector *)__return_storage_ptr__,
                                      p_Var16[4]._M_parent[1]._M_color);
                  if (EVar10 == Ignore) {
                    p_Var14 = (_Rb_tree_node_base *)&DAT_00000001;
                    if (*(char *)&p_Var16[0x25]._M_left == '\x01') {
                      *(undefined1 *)&p_Var16[0x25]._M_left = 0;
                      ConfigurePreset::~ConfigurePreset((ConfigurePreset *)pp_Var3);
                    }
                    bVar7 = false;
                  }
                  else if (EVar10 == Error) {
                    bVar7 = false;
                    p_Var14 = (_Rb_tree_node_base *)0x0;
                  }
                  else {
                    bVar7 = cmsys::SystemTools::FileIsFullPath(&local_138);
                    if (!bVar7) {
                      local_1d8._8_8_ = (this->SourceDir)._M_dataplus._M_p;
                      local_1d8._0_8_ = (this->SourceDir)._M_string_length;
                      local_1c8._M_allocated_capacity = 0;
                      local_188._0_8_ = (pointer)0x0;
                      local_188._8_8_ = &DAT_00000001;
                      local_1b8 = &local_170;
                      local_170.location.line._0_1_ = '/';
                      local_1c8._8_8_ = &DAT_00000001;
                      local_1b0 = (pointer)0x0;
                      local_1a8._M_p = (pointer)local_138._M_string_length;
                      local_1a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_138._M_dataplus._M_p;
                      local_198._M_allocated_capacity = 0;
                      views_02._M_len = 3;
                      views_02._M_array = (iterator)local_1d8;
                      local_188._16_8_ = local_1b8;
                      cmCatViews(&local_50,views_02);
                      std::__cxx11::string::operator=((string *)&local_138,(string *)&local_50);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_50._M_dataplus._M_p != &local_50.field_2) {
                        operator_delete(local_50._M_dataplus._M_p,
                                        local_50.field_2._M_allocated_capacity + 1);
                      }
                    }
                    __return_storage_ptr__ = (cmJSONState *)local_1d8;
                    cmsys::SystemTools::CollapseFullPath
                              ((string *)__return_storage_ptr__,&local_138);
                    std::__cxx11::string::operator=
                              ((string *)(p_Var16 + 0x20),(string *)__return_storage_ptr__);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1d8._0_8_ != &local_1c8) {
                      __return_storage_ptr__ = (cmJSONState *)(local_1c8._M_allocated_capacity + 1);
                      operator_delete((void *)local_1d8._0_8_,(ulong)__return_storage_ptr__);
                    }
                    bVar7 = true;
                    cmsys::SystemTools::ConvertToUnixSlashes((string *)(p_Var16 + 0x20));
                  }
                  __x = __return_storage_ptr__;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_138._M_dataplus._M_p != &local_138.field_2) {
                    __x = (cmJSONState *)(local_138.field_2._M_allocated_capacity + 1);
                    operator_delete(local_138._M_dataplus._M_p,(ulong)__x);
                  }
                  pcVar29 = __x;
                  if (!bVar7) goto LAB_003cf273;
                }
                __x = &local_118;
                if (p_Var16[0xc]._M_left != (_Base_ptr)0x0) {
                  local_1d8._0_8_ = &local_1c8;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_1d8,p_Var16[0xc]._M_parent,
                             (long)&(p_Var16[0xc]._M_left)->_M_color + (long)p_Var16[0xc]._M_parent)
                  ;
                  EVar10 = cmCMakePresetsGraphInternal::ExpandMacros
                                     ((string *)local_1d8,(MacroExpanderVector *)__x,
                                      p_Var16[4]._M_parent[1]._M_color);
                  if (EVar10 == Ignore) {
                    p_Var14 = (_Rb_tree_node_base *)&DAT_00000001;
                    if (*(char *)&p_Var16[0x25]._M_left == '\x01') {
                      *(undefined1 *)&p_Var16[0x25]._M_left = 0;
                      ConfigurePreset::~ConfigurePreset((ConfigurePreset *)pp_Var3);
                    }
                    bVar7 = false;
                  }
                  else if (EVar10 == Error) {
                    bVar7 = false;
                    p_Var14 = (_Rb_tree_node_base *)0x0;
                  }
                  else {
                    bVar7 = true;
                    __x = (cmJSONState *)local_1d8;
                    std::__cxx11::string::_M_assign((string *)(p_Var16 + 0x1e));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1d8._0_8_ != &local_1c8) {
                    __x = (cmJSONState *)(local_1c8._M_allocated_capacity + 1);
                    operator_delete((void *)local_1d8._0_8_,(ulong)__x);
                  }
                  pcVar29 = __x;
                  if (!bVar7) goto LAB_003cf273;
                }
                __x = pcVar29;
                for (p_Var19 = p_Var16[0x21]._M_right;
                    p_Var19 != (_Rb_tree_node_base *)&p_Var16[0x21]._M_parent;
                    p_Var19 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var19)) {
                  if ((char)p_Var19[4]._M_color == _S_black) {
                    __x = &local_118;
                    EVar10 = cmCMakePresetsGraphInternal::ExpandMacros
                                       ((string *)(p_Var19 + 3),(MacroExpanderVector *)__x,
                                        p_Var16[4]._M_parent[1]._M_color);
                    if (EVar10 == Ignore) {
                      p_Var14 = (_Rb_tree_node_base *)&DAT_00000001;
                      if (*(char *)&p_Var16[0x25]._M_left == '\x01') {
                        *(undefined1 *)&p_Var16[0x25]._M_left = 0;
                        ConfigurePreset::~ConfigurePreset((ConfigurePreset *)pp_Var3);
                      }
                      bVar7 = false;
                    }
                    else {
                      if (EVar10 != Error) goto LAB_003cf22d;
                      bVar7 = false;
                      p_Var14 = (_Rb_tree_node_base *)0x0;
                    }
                  }
                  else {
LAB_003cf22d:
                    bVar7 = true;
                  }
                  if (!bVar7) goto LAB_003cf273;
                }
                p_Var14 = (_Rb_tree_node_base *)&DAT_00000001;
              }
LAB_003cf273:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
                __x = (cmJSONState *)(local_c0.field_2._M_allocated_capacity + 1);
                operator_delete(local_c0._M_dataplus._M_p,(ulong)__x);
              }
            }
LAB_003cf298:
            std::
            vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
            ::~vector((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
                       *)&local_118);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
            ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                        *)local_208._16_8_,(_Link_type)__x);
            if ((((ulong)p_Var14 & 1) == 0) &&
               (cmCMakePresetsErrors::INVALID_MACRO_EXPANSION((string *)(p_Var16 + 1),pcVar1),
               ((ulong)p_Var14 & 1) == 0)) goto LAB_003d0bd3;
            p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
          } while (p_Var16 != local_140);
        }
        p_Var14 = (this->BuildPresets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_c8 = &(this->BuildPresets)._M_t._M_impl.super__Rb_tree_header._M_header;
        if (p_Var14 != local_c8) {
          pcVar1 = &this->parseState;
          do {
            if ((char)p_Var14[4]._M_color == _S_red) {
              iVar17 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
                       ::find(&local_148->_M_t,(key_type *)&p_Var14[8]._M_right);
              if (iVar17._M_node == local_140) {
                cmCMakePresetsErrors::INVALID_CONFIGURE_PRESET((string *)(p_Var14 + 1),pcVar1);
                goto LAB_003d0bd3;
              }
              sVar18 = std::
                       _Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       ::count((_Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                *)&p_Var14[4]._M_parent[1]._M_parent,
                               (key_type *)&iVar17._M_node[4]._M_parent);
              if (sVar18 == 0) {
                cmCMakePresetsErrors::CONFIGURE_PRESET_UNREACHABLE_FROM_FILE
                          ((string *)(p_Var14 + 1),pcVar1);
                goto LAB_003d0bd3;
              }
              if ((*(char *)((long)&p_Var14[9]._M_right + 1) != '\x01') ||
                 (((ulong)p_Var14[9]._M_right & 1) != 0)) {
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                ::
                _M_insert_range_unique<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                            *)&p_Var14[7]._M_parent,iVar17._M_node[8],
                           (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )&iVar17._M_node[7]._M_left);
              }
            }
            pp_Var3 = &p_Var14[0xd]._M_parent;
            std::optional<cmCMakePresetsGraph::BuildPreset>::
            emplace<cmCMakePresetsGraph::BuildPreset_const&>
                      ((optional<cmCMakePresetsGraph::BuildPreset> *)pp_Var3,
                       (BuildPreset *)(p_Var14 + 2));
            local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffff00000000;
            local_1c8._M_allocated_capacity = 0;
            local_1c8._8_8_ = local_1d8 + 8;
            local_1b0 = (pointer)0x0;
            pp_Var4 = &p_Var14[0x12]._M_right;
            local_1b8 = (Error *)local_1c8._8_8_;
            for (p_Var19 = p_Var14[0x13]._M_parent; p_Var19 != (_Rb_tree_node_base *)pp_Var4;
                p_Var19 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var19)) {
              pmVar13 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                                      *)local_1d8,(key_type *)(p_Var19 + 1));
              *pmVar13 = Unvisited;
            }
            local_188._0_8_ = (pointer)0x0;
            local_188._8_8_ = (_Base_ptr)0x0;
            local_188._16_8_ = (Error *)0x0;
            local_208._0_8_ = operator_new(0x38);
            ((MacroExpander *)local_208._0_8_)->_vptr_MacroExpander =
                 (_func_int **)&PTR_operator___00a56870;
            ((MacroExpander *)(local_208._0_8_ + 8))->_vptr_MacroExpander = (_func_int **)this;
            *(undefined1 *)&((MacroExpander *)(local_208._0_8_ + 0x30))->_vptr_MacroExpander = 0;
            std::
            vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
            ::
            emplace_back<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>
                      ((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
                        *)local_188,
                       (unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
                        *)local_208);
            if ((MacroExpander *)local_208._0_8_ != (MacroExpander *)0x0) {
              (*(*(_func_int ***)local_208._0_8_)[2])();
            }
            local_208._0_8_ = operator_new(0x18);
            ((MacroExpander *)local_208._0_8_)->_vptr_MacroExpander =
                 (_func_int **)&PTR_operator___00a56d90;
            ((MacroExpander *)(local_208._0_8_ + 8))->_vptr_MacroExpander = (_func_int **)this;
            ((MacroExpander *)(local_208._0_8_ + 0x10))->_vptr_MacroExpander =
                 (_func_int **)(p_Var14 + 2);
            std::
            vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
            ::
            emplace_back<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>
                      ((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
                        *)local_188,
                       (unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
                        *)local_208);
            if ((MacroExpander *)local_208._0_8_ != (MacroExpander *)0x0) {
              (*(*(_func_int ***)local_208._0_8_)[2])();
            }
            local_208._0_8_ = operator_new(0x20);
            ((MacroExpander *)local_208._0_8_)->_vptr_MacroExpander =
                 (_func_int **)&PTR_operator___00a56c10;
            ((MacroExpander *)(local_208._0_8_ + 8))->_vptr_MacroExpander = (_func_int **)local_1d8;
            ((MacroExpander *)(local_208._0_8_ + 0x10))->_vptr_MacroExpander = (_func_int **)pp_Var3
            ;
            ((MacroExpander *)(local_208._0_8_ + 0x18))->_vptr_MacroExpander =
                 (_func_int **)local_188;
            p_Var30 = (_Link_type)local_208;
            pvVar20 = std::
                      vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
                      ::
                      emplace_back<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>
                                ((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
                                  *)local_188,
                                 (unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
                                  *)p_Var30);
            uVar11 = (uint)pvVar20;
            if ((MacroExpander *)local_208._0_8_ != (MacroExpander *)0x0) {
              uVar11 = (*(*(_func_int ***)local_208._0_8_)[2])();
            }
            p_Var16 = p_Var14[0x13]._M_parent;
            local_230 = (ulong)uVar11;
            bVar7 = p_Var16 == (_Base_ptr)pp_Var4;
            if (!bVar7) {
              bVar7 = false;
              local_230 = (ulong)&p_Var14[2]._M_parent & 0xffffffff;
              do {
                bVar8 = true;
                if ((char)p_Var16[3]._M_color == _S_black) {
                  p_Var30 = (_Link_type)(p_Var16 + 1);
                  pmVar13 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                                          *)local_1d8,(key_type *)p_Var30);
                  EVar10 = Ok;
                  if (*pmVar13 != Verified) {
                    if (*pmVar13 == InProgress) {
                      EVar10 = Error;
                    }
                    else {
                      _Var5 = p_Var14[4]._M_parent[1]._M_color;
                      *pmVar13 = InProgress;
                      p_Var30 = (_Link_type)local_188;
                      EVar10 = cmCMakePresetsGraphInternal::ExpandMacros
                                         ((string *)(p_Var16 + 2),(MacroExpanderVector *)p_Var30,
                                          _Var5);
                      if (EVar10 == Ok) {
                        *pmVar13 = Verified;
                        EVar10 = Ok;
                      }
                    }
                  }
                  if (EVar10 == Ignore) {
                    local_230 = 1;
                    if (*(char *)&p_Var14[0x18]._M_left == '\x01') {
                      *(undefined1 *)&p_Var14[0x18]._M_left = 0;
                      BuildPreset::~BuildPreset((BuildPreset *)pp_Var3);
                    }
                    bVar8 = false;
                  }
                  else if (EVar10 == Error) {
                    p_Var30 = (_Link_type)pcVar1;
                    cmCMakePresetsErrors::INVALID_PRESET_NAMED
                              ((string *)&p_Var14[2]._M_parent,pcVar1);
                    bVar8 = false;
                    local_230 = 0;
                  }
                }
                if (!bVar8) break;
                p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
                bVar7 = p_Var16 == (_Base_ptr)pp_Var4;
              } while (!bVar7);
            }
            if (bVar7) {
              p_Var16 = p_Var14[6]._M_left;
              if (p_Var16 != (_Base_ptr)0x0) {
                local_208[1] = 0;
                p_Var30 = (_Link_type)local_188;
                cVar9 = (**(code **)(*(long *)p_Var16 + 0x10))
                                  (p_Var16,(_Link_type)local_188,p_Var14[4]._M_parent[1]._M_color);
                if (cVar9 == '\0') {
                  p_Var30 = (_Link_type)pcVar1;
                  cmCMakePresetsErrors::INVALID_PRESET_NAMED((string *)&p_Var14[2]._M_parent,pcVar1)
                  ;
                  bVar7 = false;
                  local_230 = 0;
                }
                else if (local_208[1] == _S_red >> 8) {
                  local_230 = 1;
                  if (*(char *)&p_Var14[0x18]._M_left == '\x01') {
                    *(undefined1 *)&p_Var14[0x18]._M_left = 0;
                    BuildPreset::~BuildPreset((BuildPreset *)pp_Var3);
                  }
                  bVar7 = false;
                }
                else {
                  *(undefined1 *)&p_Var14[0x12]._M_parent = local_208[0];
                  bVar7 = true;
                }
                if (!bVar7) goto LAB_003cf792;
              }
              p_Var16 = p_Var14[0x15]._M_left;
              p_Var15 = p_Var14[0x15]._M_right;
              bVar7 = p_Var16 == p_Var15;
              pcVar28 = this;
              if (!bVar7) {
                bVar7 = false;
                do {
                  p_Var30 = (_Link_type)local_188;
                  EVar10 = cmCMakePresetsGraphInternal::ExpandMacros
                                     ((string *)p_Var16,(MacroExpanderVector *)local_188,
                                      p_Var14[4]._M_parent[1]._M_color);
                  if (EVar10 == Error) {
                    bVar8 = false;
                    pcVar28 = (cmCMakePresetsGraph *)0x0;
                  }
                  else if (EVar10 == Ignore) {
                    pcVar28 = (cmCMakePresetsGraph *)&DAT_00000001;
                    if (*(char *)&p_Var14[0x18]._M_left == '\x01') {
                      *(undefined1 *)&p_Var14[0x18]._M_left = 0;
                      BuildPreset::~BuildPreset((BuildPreset *)pp_Var3);
                    }
                    bVar8 = false;
                  }
                  else {
                    bVar8 = true;
                  }
                  if (!bVar8) break;
                  p_Var16 = p_Var16 + 1;
                  bVar7 = p_Var16 == p_Var15;
                } while (!bVar7);
              }
              if (!bVar7) {
                local_230 = (ulong)pcVar28 & 0xffffffff;
                goto LAB_003cf792;
              }
              p_Var15 = p_Var14[0x17]._M_right;
              local_230 = (ulong)pcVar28 & 0xffffffff;
              for (p_Var16 = p_Var14[0x17]._M_left; p_Var16 != p_Var15; p_Var16 = p_Var16 + 1) {
                p_Var30 = (_Link_type)local_188;
                EVar10 = cmCMakePresetsGraphInternal::ExpandMacros
                                   ((string *)p_Var16,(MacroExpanderVector *)local_188,
                                    p_Var14[4]._M_parent[1]._M_color);
                if (EVar10 == Error) {
                  bVar7 = false;
                  local_230 = 0;
                }
                else if (EVar10 == Ignore) {
                  local_230 = 1;
                  if (*(char *)&p_Var14[0x18]._M_left == '\x01') {
                    *(undefined1 *)&p_Var14[0x18]._M_left = 0;
                    BuildPreset::~BuildPreset((BuildPreset *)pp_Var3);
                  }
                  bVar7 = false;
                }
                else {
                  bVar7 = true;
                }
                if (!bVar7) goto LAB_003cf792;
              }
              std::
              vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
              ::~vector((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
                         *)local_188);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
              ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                          *)local_1c8._M_allocated_capacity,p_Var30);
            }
            else {
LAB_003cf792:
              std::
              vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
              ::~vector((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
                         *)local_188);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
              ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                          *)local_1c8._M_allocated_capacity,p_Var30);
              if ((local_230 & 1) == 0) {
                cmCMakePresetsErrors::INVALID_MACRO_EXPANSION((string *)(p_Var14 + 1),pcVar1);
                goto LAB_003d0bd3;
              }
            }
            p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
          } while (p_Var14 != local_c8);
        }
        p_Var14 = (this->TestPresets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_118.doc.field_2._8_8_ = &(this->TestPresets)._M_t._M_impl.super__Rb_tree_header;
        if (p_Var14 != (_Rb_tree_node_base *)local_118.doc.field_2._8_8_) {
          pcVar1 = &this->parseState;
          do {
            if ((char)p_Var14[4]._M_color == _S_red) {
              iVar17 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
                       ::find(&local_148->_M_t,(key_type *)&p_Var14[8]._M_right);
              if (iVar17._M_node == local_140) {
                cmCMakePresetsErrors::INVALID_CONFIGURE_PRESET((string *)(p_Var14 + 1),pcVar1);
                goto LAB_003d0bd3;
              }
              sVar18 = std::
                       _Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       ::count((_Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                *)&p_Var14[4]._M_parent[1]._M_parent,
                               (key_type *)&iVar17._M_node[4]._M_parent);
              if (sVar18 == 0) {
                cmCMakePresetsErrors::CONFIGURE_PRESET_UNREACHABLE_FROM_FILE
                          ((string *)(p_Var14 + 1),pcVar1);
                goto LAB_003d0bd3;
              }
              if ((*(char *)((long)&p_Var14[9]._M_right + 1) != '\x01') ||
                 (((ulong)p_Var14[9]._M_right & 1) != 0)) {
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                ::
                _M_insert_range_unique<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                            *)&p_Var14[7]._M_parent,iVar17._M_node[8],
                           (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )&iVar17._M_node[7]._M_left);
              }
            }
            pp_Var3 = &p_Var14[0x1e]._M_parent;
            std::optional<cmCMakePresetsGraph::TestPreset>::
            emplace<cmCMakePresetsGraph::TestPreset_const&>
                      ((optional<cmCMakePresetsGraph::TestPreset> *)pp_Var3,
                       (TestPreset *)(p_Var14 + 2));
            local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffff00000000;
            local_1c8._M_allocated_capacity = 0;
            local_1c8._8_8_ = local_1d8 + 8;
            local_1b0 = (pointer)0x0;
            pp_Var4 = &p_Var14[0x23]._M_right;
            local_1b8 = (Error *)local_1c8._8_8_;
            for (p_Var19 = p_Var14[0x24]._M_parent; p_Var19 != (_Rb_tree_node_base *)pp_Var4;
                p_Var19 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var19)) {
              pmVar13 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                                      *)local_1d8,(key_type *)(p_Var19 + 1));
              *pmVar13 = Unvisited;
            }
            local_188._0_8_ = (pointer)0x0;
            local_188._8_8_ = (_Base_ptr)0x0;
            local_188._16_8_ = (Error *)0x0;
            local_208._0_8_ = operator_new(0x38);
            ((MacroExpander *)local_208._0_8_)->_vptr_MacroExpander =
                 (_func_int **)&PTR_operator___00a56870;
            ((MacroExpander *)(local_208._0_8_ + 8))->_vptr_MacroExpander = (_func_int **)this;
            *(undefined1 *)&((MacroExpander *)(local_208._0_8_ + 0x30))->_vptr_MacroExpander = 0;
            std::
            vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
            ::
            emplace_back<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>
                      ((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
                        *)local_188,
                       (unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
                        *)local_208);
            if ((MacroExpander *)local_208._0_8_ != (MacroExpander *)0x0) {
              (*(*(_func_int ***)local_208._0_8_)[2])();
            }
            local_208._0_8_ = operator_new(0x18);
            ((MacroExpander *)local_208._0_8_)->_vptr_MacroExpander =
                 (_func_int **)&PTR_operator___00a56dd0;
            ((MacroExpander *)(local_208._0_8_ + 8))->_vptr_MacroExpander = (_func_int **)this;
            ((MacroExpander *)(local_208._0_8_ + 0x10))->_vptr_MacroExpander =
                 (_func_int **)(p_Var14 + 2);
            std::
            vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
            ::
            emplace_back<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>
                      ((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
                        *)local_188,
                       (unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
                        *)local_208);
            if ((MacroExpander *)local_208._0_8_ != (MacroExpander *)0x0) {
              (*(*(_func_int ***)local_208._0_8_)[2])();
            }
            local_208._0_8_ = operator_new(0x20);
            ((MacroExpander *)local_208._0_8_)->_vptr_MacroExpander =
                 (_func_int **)&PTR_operator___00a56c50;
            ((MacroExpander *)(local_208._0_8_ + 8))->_vptr_MacroExpander = (_func_int **)local_1d8;
            ((MacroExpander *)(local_208._0_8_ + 0x10))->_vptr_MacroExpander = (_func_int **)pp_Var3
            ;
            ((MacroExpander *)(local_208._0_8_ + 0x18))->_vptr_MacroExpander =
                 (_func_int **)local_188;
            p_Var30 = (_Link_type)local_208;
            p_Var19 = (_Rb_tree_node_base *)
                      std::
                      vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
                      ::
                      emplace_back<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>
                                ((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
                                  *)local_188,
                                 (unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
                                  *)p_Var30);
            if ((MacroExpander *)local_208._0_8_ != (MacroExpander *)0x0) {
              uVar11 = (*(*(_func_int ***)local_208._0_8_)[2])();
              p_Var19 = (_Rb_tree_node_base *)(ulong)uVar11;
            }
            local_230 = (ulong)p_Var19 & 0xffffffff;
            bVar7 = p_Var14[0x24]._M_parent == (_Base_ptr)pp_Var4;
            if (!bVar7) {
              pp_Var2 = &p_Var14[2]._M_parent;
              bVar7 = false;
              local_230 = (ulong)pp_Var2 & 0xffffffff;
              p_Var19 = (_Rb_tree_node_base *)pp_Var2;
              p_Var16 = p_Var14[0x24]._M_parent;
              do {
                bVar8 = true;
                if ((char)p_Var16[3]._M_color == _S_black) {
                  p_Var30 = (_Link_type)(p_Var16 + 1);
                  pmVar13 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                                          *)local_1d8,(key_type *)p_Var30);
                  p_Var19 = (_Rb_tree_node_base *)0x0;
                  if (*pmVar13 != Verified) {
                    if (*pmVar13 == InProgress) {
                      p_Var19 = (_Rb_tree_node_base *)0x2;
                    }
                    else {
                      _Var5 = p_Var14[4]._M_parent[1]._M_color;
                      *pmVar13 = InProgress;
                      p_Var30 = (_Link_type)local_188;
                      EVar10 = cmCMakePresetsGraphInternal::ExpandMacros
                                         ((string *)(p_Var16 + 2),(MacroExpanderVector *)p_Var30,
                                          _Var5);
                      p_Var19 = (_Rb_tree_node_base *)(ulong)EVar10;
                      if (EVar10 == Ok) {
                        *pmVar13 = Verified;
                        p_Var19 = (_Rb_tree_node_base *)0x0;
                      }
                    }
                  }
                  if ((int)p_Var19 == 1) {
                    p_Var19 = (_Rb_tree_node_base *)&DAT_00000001;
                    local_230 = 1;
                    if (*(char *)&p_Var14[0x3a]._M_left == '\x01') {
                      *(undefined1 *)&p_Var14[0x3a]._M_left = 0;
                      TestPreset::~TestPreset((TestPreset *)pp_Var3);
                      p_Var19 = extraout_RAX_00;
                    }
                    bVar8 = false;
                  }
                  else if ((int)p_Var19 == 2) {
                    p_Var30 = (_Link_type)pcVar1;
                    cmCMakePresetsErrors::INVALID_PRESET_NAMED((string *)pp_Var2,pcVar1);
                    bVar8 = false;
                    local_230 = 0;
                    p_Var19 = extraout_RAX;
                  }
                }
                if (!bVar8) break;
                p_Var19 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
                bVar7 = p_Var19 == (_Rb_tree_node_base *)pp_Var4;
                p_Var16 = p_Var19;
              } while (!bVar7);
            }
            uVar11 = (uint)p_Var19;
            if (bVar7) {
              p_Var16 = p_Var14[6]._M_left;
              if (p_Var16 != (_Base_ptr)0x0) {
                local_208[1] = 0;
                p_Var30 = (_Link_type)local_188;
                cVar9 = (**(code **)(*(long *)p_Var16 + 0x10))
                                  (p_Var16,(_Link_type)local_188,p_Var14[4]._M_parent[1]._M_color);
                if (cVar9 == '\0') {
                  p_Var30 = (_Link_type)pcVar1;
                  cmCMakePresetsErrors::INVALID_PRESET_NAMED((string *)&p_Var14[2]._M_parent,pcVar1)
                  ;
                  uVar11 = 0;
                  local_230 = 0;
                }
                else if (local_208[1] == _S_red >> 8) {
                  local_230 = 1;
                  if (*(char *)&p_Var14[0x3a]._M_left == '\x01') {
                    *(undefined1 *)&p_Var14[0x3a]._M_left = 0;
                    TestPreset::~TestPreset((TestPreset *)pp_Var3);
                  }
                  uVar11 = 0;
                }
                else {
                  *(undefined1 *)&p_Var14[0x23]._M_parent = local_208[0];
                  uVar11 = 1;
                }
                if ((char)uVar11 == '\0') goto LAB_003cfe15;
              }
              p_Var16 = p_Var14[0x27]._M_parent;
              p_Var15 = p_Var14[0x27]._M_left;
              local_230 = (ulong)uVar11;
              bVar7 = p_Var16 == p_Var15;
              if (!bVar7) {
                bVar7 = false;
                local_230 = (ulong)uVar11;
                do {
                  p_Var30 = (_Link_type)local_188;
                  EVar10 = cmCMakePresetsGraphInternal::ExpandMacros
                                     ((string *)p_Var16,(MacroExpanderVector *)local_188,
                                      p_Var14[4]._M_parent[1]._M_color);
                  if (EVar10 == Error) {
                    bVar8 = false;
                    local_230 = 0;
                  }
                  else if (EVar10 == Ignore) {
                    local_230 = 1;
                    if (*(char *)&p_Var14[0x3a]._M_left == '\x01') {
                      *(undefined1 *)&p_Var14[0x3a]._M_left = 0;
                      TestPreset::~TestPreset((TestPreset *)pp_Var3);
                    }
                    bVar8 = false;
                  }
                  else {
                    bVar8 = true;
                  }
                  if (!bVar8) break;
                  p_Var16 = p_Var16 + 1;
                  bVar7 = p_Var16 == p_Var15;
                } while (!bVar7);
              }
              if (!bVar7) goto LAB_003cfe15;
              if ((char)p_Var14[0x2c]._M_color != _S_black) {
LAB_003cfc57:
                if ((char)p_Var14[0x37]._M_color != _S_black) goto LAB_003cfde4;
                if (*(char *)&p_Var14[0x31]._M_parent != '\x01') goto LAB_003cfcfb;
                p_Var30 = (_Link_type)local_188;
                EVar10 = cmCMakePresetsGraphInternal::ExpandMacros
                                   ((string *)&p_Var14[0x2c]._M_parent,
                                    (MacroExpanderVector *)local_188,
                                    p_Var14[4]._M_parent[1]._M_color);
                if (EVar10 == Ignore) goto LAB_003cfe4d;
                if (EVar10 == Error) goto LAB_003d0b81;
                p_Var30 = (_Link_type)local_188;
                EVar10 = cmCMakePresetsGraphInternal::ExpandMacros
                                   ((string *)&p_Var14[0x2d]._M_parent,
                                    (MacroExpanderVector *)local_188,
                                    p_Var14[4]._M_parent[1]._M_color);
                if (EVar10 == Ignore) goto LAB_003cfe4d;
                if (EVar10 != Error) {
                  if (*(char *)&p_Var14[0x30]._M_right == '\x01') {
                    p_Var30 = (_Link_type)local_188;
                    EVar10 = cmCMakePresetsGraphInternal::ExpandMacros
                                       ((string *)&p_Var14[0x2f]._M_right,
                                        (MacroExpanderVector *)local_188,
                                        p_Var14[4]._M_parent[1]._M_color);
                    if (EVar10 == Ignore) goto LAB_003cfe4d;
                    if (EVar10 == Error) goto LAB_003d0b81;
                  }
LAB_003cfcfb:
                  if (*(char *)&p_Var14[0x36]._M_right != '\x01') {
LAB_003cfde4:
                    if (*(char *)&p_Var14[0x3a]._M_parent == '\x01') {
                      p_Var30 = (_Link_type)local_188;
                      EVar10 = cmCMakePresetsGraphInternal::ExpandMacros
                                         ((string *)&p_Var14[0x37]._M_right,
                                          (MacroExpanderVector *)local_188,
                                          p_Var14[4]._M_parent[1]._M_color);
                      if (EVar10 == Ignore) goto LAB_003cfe4d;
                      if (EVar10 == Error) goto LAB_003d0b81;
                    }
                    goto LAB_003cfe6a;
                  }
                  p_Var30 = (_Link_type)local_188;
                  EVar10 = cmCMakePresetsGraphInternal::ExpandMacros
                                     ((string *)&p_Var14[0x31]._M_left,
                                      (MacroExpanderVector *)local_188,
                                      p_Var14[4]._M_parent[1]._M_color);
                  if (EVar10 == Ignore) goto LAB_003cfe4d;
                  if (EVar10 != Error) {
                    p_Var30 = (_Link_type)local_188;
                    EVar10 = cmCMakePresetsGraphInternal::ExpandMacros
                                       ((string *)&p_Var14[0x32]._M_left,
                                        (MacroExpanderVector *)local_188,
                                        p_Var14[4]._M_parent[1]._M_color);
                    if (EVar10 == Ignore) goto LAB_003cfe4d;
                    if (EVar10 != Error) {
                      if (*(char *)&p_Var14[0x36]._M_left != '\x01') goto LAB_003cfde4;
                      p_Var30 = (_Link_type)local_188;
                      EVar10 = cmCMakePresetsGraphInternal::ExpandMacros
                                         ((string *)&p_Var14[0x33]._M_left,
                                          (MacroExpanderVector *)local_188,
                                          p_Var14[4]._M_parent[1]._M_color);
                      if (EVar10 == Ignore) goto LAB_003cfe4d;
                      if (EVar10 != Error) {
                        p_Var30 = (_Link_type)local_188;
                        EVar10 = cmCMakePresetsGraphInternal::ExpandMacros
                                           ((string *)&p_Var14[0x34]._M_left,
                                            (MacroExpanderVector *)local_188,
                                            p_Var14[4]._M_parent[1]._M_color);
                        if (EVar10 == Ignore) goto LAB_003cfe4d;
                        if (EVar10 != Error) {
                          p_Var30 = (_Link_type)local_188;
                          EVar10 = cmCMakePresetsGraphInternal::ExpandMacros
                                             ((string *)&p_Var14[0x35]._M_left,
                                              (MacroExpanderVector *)local_188,
                                              p_Var14[4]._M_parent[1]._M_color);
                          if (EVar10 == Ignore) goto LAB_003cfe4d;
                          if (EVar10 != Error) goto LAB_003cfde4;
                        }
                      }
                    }
                  }
                }
LAB_003d0b81:
                std::
                vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
                ::~vector((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
                           *)local_188);
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                            *)local_1c8._M_allocated_capacity,p_Var30);
                goto LAB_003d0b98;
              }
              p_Var30 = (_Link_type)local_188;
              EVar10 = cmCMakePresetsGraphInternal::ExpandMacros
                                 ((string *)&p_Var14[0x28]._M_right,(MacroExpanderVector *)local_188
                                  ,p_Var14[4]._M_parent[1]._M_color);
              if (EVar10 != Ignore) {
                if (EVar10 != Error) {
                  p_Var30 = (_Link_type)local_188;
                  EVar10 = cmCMakePresetsGraphInternal::ExpandMacros
                                     ((string *)&p_Var14[0x29]._M_right,
                                      (MacroExpanderVector *)local_188,
                                      p_Var14[4]._M_parent[1]._M_color);
                  if (EVar10 == Ignore) goto LAB_003cfe4d;
                  if (EVar10 != Error) goto LAB_003cfc57;
                }
                goto LAB_003d0b81;
              }
LAB_003cfe4d:
              if (*(char *)&p_Var14[0x3a]._M_left != '\0') {
                *(undefined1 *)&p_Var14[0x3a]._M_left = 0;
                TestPreset::~TestPreset((TestPreset *)pp_Var3);
              }
LAB_003cfe6a:
              std::
              vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
              ::~vector((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
                         *)local_188);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
              ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                          *)local_1c8._M_allocated_capacity,p_Var30);
            }
            else {
LAB_003cfe15:
              std::
              vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
              ::~vector((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
                         *)local_188);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
              ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                          *)local_1c8._M_allocated_capacity,p_Var30);
              if ((local_230 & 1) == 0) {
LAB_003d0b98:
                cmCMakePresetsErrors::INVALID_MACRO_EXPANSION((string *)(p_Var14 + 1),pcVar1);
                goto LAB_003d0bd3;
              }
            }
            p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
          } while (p_Var14 != (_Rb_tree_node_base *)local_118.doc.field_2._8_8_);
        }
        p_Var14 = (this->PackagePresets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_118.doc.field_2._M_allocated_capacity =
             (size_type)&(this->PackagePresets)._M_t._M_impl.super__Rb_tree_header;
        if (p_Var14 != (_Rb_tree_node_base *)local_118.doc.field_2._M_allocated_capacity) {
          pcVar1 = &this->parseState;
          do {
            if ((char)p_Var14[4]._M_color == _S_red) {
              iVar17 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
                       ::find(&local_148->_M_t,(key_type *)&p_Var14[8]._M_right);
              if (iVar17._M_node == local_140) {
                cmCMakePresetsErrors::INVALID_CONFIGURE_PRESET((string *)(p_Var14 + 1),pcVar1);
                goto LAB_003d0bd3;
              }
              sVar18 = std::
                       _Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       ::count((_Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                *)&p_Var14[4]._M_parent[1]._M_parent,
                               (key_type *)&iVar17._M_node[4]._M_parent);
              if (sVar18 == 0) {
                cmCMakePresetsErrors::CONFIGURE_PRESET_UNREACHABLE_FROM_FILE
                          ((string *)(p_Var14 + 1),pcVar1);
                goto LAB_003d0bd3;
              }
              if ((*(char *)((long)&p_Var14[9]._M_right + 1) != '\x01') ||
                 (((ulong)p_Var14[9]._M_right & 1) != 0)) {
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                ::
                _M_insert_range_unique<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                            *)&p_Var14[7]._M_parent,iVar17._M_node[8],
                           (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )&iVar17._M_node[7]._M_left);
              }
            }
            pp_Var3 = &p_Var14[0x12]._M_parent;
            std::optional<cmCMakePresetsGraph::PackagePreset>::
            emplace<cmCMakePresetsGraph::PackagePreset_const&>
                      ((optional<cmCMakePresetsGraph::PackagePreset> *)pp_Var3,
                       (PackagePreset *)(p_Var14 + 2));
            local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffff00000000;
            local_1c8._M_allocated_capacity = 0;
            local_1c8._8_8_ = local_1d8 + 8;
            local_1b0 = (pointer)0x0;
            pp_Var4 = &p_Var14[0x17]._M_right;
            local_1b8 = (Error *)local_1c8._8_8_;
            for (p_Var19 = p_Var14[0x18]._M_parent; p_Var19 != (_Rb_tree_node_base *)pp_Var4;
                p_Var19 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var19)) {
              pmVar13 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                                      *)local_1d8,(key_type *)(p_Var19 + 1));
              *pmVar13 = Unvisited;
            }
            local_188._0_8_ = (pointer)0x0;
            local_188._8_8_ = (_Base_ptr)0x0;
            local_188._16_8_ = (Error *)0x0;
            local_208._0_8_ = operator_new(0x38);
            ((MacroExpander *)local_208._0_8_)->_vptr_MacroExpander =
                 (_func_int **)&PTR_operator___00a56870;
            ((MacroExpander *)(local_208._0_8_ + 8))->_vptr_MacroExpander = (_func_int **)this;
            *(undefined1 *)&((MacroExpander *)(local_208._0_8_ + 0x30))->_vptr_MacroExpander = 0;
            std::
            vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
            ::
            emplace_back<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>
                      ((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
                        *)local_188,
                       (unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
                        *)local_208);
            if ((MacroExpander *)local_208._0_8_ != (MacroExpander *)0x0) {
              (*(*(_func_int ***)local_208._0_8_)[2])();
            }
            local_208._0_8_ = operator_new(0x18);
            ((MacroExpander *)local_208._0_8_)->_vptr_MacroExpander =
                 (_func_int **)&PTR_operator___00a56e10;
            ((MacroExpander *)(local_208._0_8_ + 8))->_vptr_MacroExpander = (_func_int **)this;
            ((MacroExpander *)(local_208._0_8_ + 0x10))->_vptr_MacroExpander =
                 (_func_int **)(p_Var14 + 2);
            std::
            vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
            ::
            emplace_back<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>
                      ((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
                        *)local_188,
                       (unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
                        *)local_208);
            if ((MacroExpander *)local_208._0_8_ != (MacroExpander *)0x0) {
              (*(*(_func_int ***)local_208._0_8_)[2])();
            }
            local_208._0_8_ = operator_new(0x20);
            ((MacroExpander *)local_208._0_8_)->_vptr_MacroExpander =
                 (_func_int **)&PTR_operator___00a56c90;
            ((MacroExpander *)(local_208._0_8_ + 8))->_vptr_MacroExpander = (_func_int **)local_1d8;
            ((MacroExpander *)(local_208._0_8_ + 0x10))->_vptr_MacroExpander = (_func_int **)pp_Var3
            ;
            ((MacroExpander *)(local_208._0_8_ + 0x18))->_vptr_MacroExpander =
                 (_func_int **)local_188;
            p_Var30 = (_Link_type)local_208;
            p_Var19 = (_Rb_tree_node_base *)
                      std::
                      vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
                      ::
                      emplace_back<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>
                                ((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
                                  *)local_188,
                                 (unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
                                  *)p_Var30);
            if ((MacroExpander *)local_208._0_8_ != (MacroExpander *)0x0) {
              uVar11 = (*(*(_func_int ***)local_208._0_8_)[2])();
              p_Var19 = (_Rb_tree_node_base *)(ulong)uVar11;
            }
            local_230 = (ulong)p_Var19 & 0xffffffff;
            bVar7 = p_Var14[0x18]._M_parent == (_Base_ptr)pp_Var4;
            if (!bVar7) {
              pp_Var2 = &p_Var14[2]._M_parent;
              bVar7 = false;
              local_230 = (ulong)pp_Var2 & 0xffffffff;
              p_Var19 = (_Rb_tree_node_base *)pp_Var2;
              p_Var16 = p_Var14[0x18]._M_parent;
              do {
                bVar8 = true;
                if ((char)p_Var16[3]._M_color == _S_black) {
                  p_Var30 = (_Link_type)(p_Var16 + 1);
                  pmVar13 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                                          *)local_1d8,(key_type *)p_Var30);
                  p_Var19 = (_Rb_tree_node_base *)0x0;
                  if (*pmVar13 != Verified) {
                    if (*pmVar13 == InProgress) {
                      p_Var19 = (_Rb_tree_node_base *)0x2;
                    }
                    else {
                      _Var5 = p_Var14[4]._M_parent[1]._M_color;
                      *pmVar13 = InProgress;
                      p_Var30 = (_Link_type)local_188;
                      EVar10 = cmCMakePresetsGraphInternal::ExpandMacros
                                         ((string *)(p_Var16 + 2),(MacroExpanderVector *)p_Var30,
                                          _Var5);
                      p_Var19 = (_Rb_tree_node_base *)(ulong)EVar10;
                      if (EVar10 == Ok) {
                        *pmVar13 = Verified;
                        p_Var19 = (_Rb_tree_node_base *)0x0;
                      }
                    }
                  }
                  if ((int)p_Var19 == 1) {
                    p_Var19 = (_Rb_tree_node_base *)&DAT_00000001;
                    local_230 = 1;
                    if (*(char *)&p_Var14[0x22]._M_left == '\x01') {
                      *(undefined1 *)&p_Var14[0x22]._M_left = 0;
                      PackagePreset::~PackagePreset((PackagePreset *)pp_Var3);
                      p_Var19 = extraout_RAX_02;
                    }
                    bVar8 = false;
                  }
                  else if ((int)p_Var19 == 2) {
                    p_Var30 = (_Link_type)pcVar1;
                    cmCMakePresetsErrors::INVALID_PRESET_NAMED((string *)pp_Var2,pcVar1);
                    bVar8 = false;
                    local_230 = 0;
                    p_Var19 = extraout_RAX_01;
                  }
                }
                if (!bVar8) break;
                p_Var19 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
                bVar7 = p_Var19 == (_Rb_tree_node_base *)pp_Var4;
                p_Var16 = p_Var19;
              } while (!bVar7);
            }
            uVar11 = (uint)p_Var19;
            if (bVar7) {
              p_Var16 = p_Var14[6]._M_left;
              if (p_Var16 != (_Base_ptr)0x0) {
                local_208[1] = 0;
                p_Var30 = (_Link_type)local_188;
                cVar9 = (**(code **)(*(long *)p_Var16 + 0x10))
                                  (p_Var16,(_Link_type)local_188,p_Var14[4]._M_parent[1]._M_color);
                if (cVar9 == '\0') {
                  p_Var30 = (_Link_type)pcVar1;
                  cmCMakePresetsErrors::INVALID_PRESET_NAMED((string *)&p_Var14[2]._M_parent,pcVar1)
                  ;
                  uVar11 = 0;
                  local_230 = 0;
                }
                else if (local_208[1] == _S_red >> 8) {
                  local_230 = 1;
                  if (*(char *)&p_Var14[0x22]._M_left == '\x01') {
                    *(undefined1 *)&p_Var14[0x22]._M_left = 0;
                    PackagePreset::~PackagePreset((PackagePreset *)pp_Var3);
                  }
                  uVar11 = 0;
                }
                else {
                  *(undefined1 *)&p_Var14[0x17]._M_parent = local_208[0];
                  uVar11 = 1;
                }
                if ((char)uVar11 == '\0') goto LAB_003d0393;
              }
              p_Var16 = p_Var14[0x1c]._M_left;
              local_230 = (ulong)uVar11;
              bVar7 = p_Var16 == p_Var14 + 0x1c;
              if (!bVar7) {
                bVar7 = false;
                local_230 = (ulong)uVar11;
                do {
                  p_Var30 = (_Link_type)local_188;
                  EVar10 = cmCMakePresetsGraphInternal::ExpandMacros
                                     ((string *)(p_Var16 + 2),(MacroExpanderVector *)local_188,
                                      p_Var14[4]._M_parent[1]._M_color);
                  if (EVar10 == Error) {
                    bVar8 = false;
                    local_230 = 0;
                  }
                  else if (EVar10 == Ignore) {
                    local_230 = 1;
                    if (*(char *)&p_Var14[0x22]._M_left == '\x01') {
                      *(undefined1 *)&p_Var14[0x22]._M_left = 0;
                      PackagePreset::~PackagePreset((PackagePreset *)pp_Var3);
                    }
                    bVar8 = false;
                  }
                  else {
                    bVar8 = true;
                  }
                  if (!bVar8) break;
                  p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
                  bVar7 = p_Var16 == p_Var14 + 0x1c;
                } while (!bVar7);
              }
              if (!bVar7) goto LAB_003d0393;
              p_Var30 = (_Link_type)local_188;
              EVar10 = cmCMakePresetsGraphInternal::ExpandMacros
                                 ((string *)&p_Var14[0x1d]._M_parent,
                                  (MacroExpanderVector *)local_188,p_Var14[4]._M_parent[1]._M_color)
              ;
              if (EVar10 != Ignore) {
                if (EVar10 != Error) {
                  p_Var30 = (_Link_type)local_188;
                  EVar10 = cmCMakePresetsGraphInternal::ExpandMacros
                                     ((string *)&p_Var14[0x1e]._M_left,
                                      (MacroExpanderVector *)local_188,
                                      p_Var14[4]._M_parent[1]._M_color);
                  if (EVar10 == Ignore) goto LAB_003d03cb;
                  if (EVar10 == Error) goto LAB_003d0bab;
                  p_Var30 = (_Link_type)local_188;
                  EVar10 = cmCMakePresetsGraphInternal::ExpandMacros
                                     ((string *)&p_Var14[0x1f]._M_left,
                                      (MacroExpanderVector *)local_188,
                                      p_Var14[4]._M_parent[1]._M_color);
                  if (EVar10 == Ignore) goto LAB_003d03cb;
                  if (EVar10 == Error) goto LAB_003d0bab;
                  p_Var30 = (_Link_type)local_188;
                  EVar10 = cmCMakePresetsGraphInternal::ExpandMacros
                                     ((string *)&p_Var14[0x20]._M_left,
                                      (MacroExpanderVector *)local_188,
                                      p_Var14[4]._M_parent[1]._M_color);
                  if (EVar10 == Ignore) goto LAB_003d03cb;
                  if (EVar10 == Error) goto LAB_003d0bab;
                  p_Var30 = (_Link_type)local_188;
                  EVar10 = cmCMakePresetsGraphInternal::ExpandMacros
                                     ((string *)&p_Var14[0x21]._M_left,
                                      (MacroExpanderVector *)local_188,
                                      p_Var14[4]._M_parent[1]._M_color);
                  if (EVar10 == Ignore) goto LAB_003d03cb;
                  if (EVar10 == Error) goto LAB_003d0bab;
                  goto LAB_003d03e8;
                }
LAB_003d0bab:
                std::
                vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
                ::~vector((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
                           *)local_188);
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                            *)local_1c8._M_allocated_capacity,p_Var30);
                goto LAB_003d0bc2;
              }
LAB_003d03cb:
              if (*(char *)&p_Var14[0x22]._M_left != '\0') {
                *(undefined1 *)&p_Var14[0x22]._M_left = 0;
                PackagePreset::~PackagePreset((PackagePreset *)pp_Var3);
              }
LAB_003d03e8:
              std::
              vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
              ::~vector((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
                         *)local_188);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
              ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                          *)local_1c8._M_allocated_capacity,p_Var30);
            }
            else {
LAB_003d0393:
              std::
              vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
              ::~vector((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
                         *)local_188);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
              ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                          *)local_1c8._M_allocated_capacity,p_Var30);
              if ((local_230 & 1) == 0) {
LAB_003d0bc2:
                cmCMakePresetsErrors::INVALID_MACRO_EXPANSION((string *)(p_Var14 + 1),pcVar1);
                goto LAB_003d0bd3;
              }
            }
            p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
          } while (p_Var14 != (_Rb_tree_node_base *)local_118.doc.field_2._M_allocated_capacity);
        }
        p_Var14 = (this->WorkflowPresets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_68 = &(this->WorkflowPresets)._M_t._M_impl.super__Rb_tree_header._M_header;
        bVar7 = p_Var14 == local_68;
        if (!bVar7) {
          local_70 = &this->BuildPresets;
          local_78 = &this->TestPresets;
          local_80 = &this->PackagePresets;
          pcVar1 = &this->parseState;
          uVar32 = local_198._12_4_;
          do {
            uVar33 = (ulong)(uint)uVar32;
            p_Var16 = p_Var14[8]._M_right;
            p_Var15 = *(_Base_ptr *)(p_Var14 + 9);
            bVar8 = p_Var16 == p_Var15;
            if (bVar8) {
              bVar34 = true;
            }
            else {
              p_Var26 = (_Base_ptr)0x0;
              do {
                _Var5 = p_Var16->_M_color;
                if ((p_Var26 == (_Base_ptr)0x0) && (_Var5 != _S_red)) {
                  cmCMakePresetsErrors::FIRST_WORKFLOW_STEP_NOT_CONFIGURE
                            ((string *)&p_Var16->_M_parent,pcVar1);
LAB_003d04b8:
                  uVar21 = 0;
                  goto LAB_003d071a;
                }
                if ((p_Var26 != (_Base_ptr)0x0) && (_Var5 == _S_red)) {
                  cmCMakePresetsErrors::CONFIGURE_WORKFLOW_STEP_NOT_FIRST
                            ((string *)&p_Var16->_M_parent,pcVar1);
                  goto LAB_003d04b8;
                }
                switch(_Var5) {
                case _S_red:
                  cVar22 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
                           ::find(&local_148->_M_t,(key_type *)&p_Var16->_M_parent);
                  if (cVar22._M_node != local_140) {
                    sVar18 = std::
                             _Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                             ::count((_Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                      *)&p_Var14[4]._M_parent[1]._M_parent,
                                     (key_type *)&cVar22._M_node[4]._M_parent);
                    if (sVar18 == 0) goto LAB_003d06bb;
                    p_Var26 = cVar22._M_node + 2;
                    uVar33 = CONCAT71((int7)((ulong)p_Var26 >> 8),1);
                    break;
                  }
LAB_003d06ac:
                  cmCMakePresetsErrors::INVALID_WORKFLOW_STEPS((string *)&p_Var16->_M_parent,pcVar1)
                  ;
                  goto LAB_003d06c8;
                case _S_black:
                  cVar25 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>_>
                           ::find(&local_70->_M_t,(key_type *)&p_Var16->_M_parent);
                  if (cVar25._M_node == local_c8) goto LAB_003d06ac;
                  sVar18 = std::
                           _Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           ::count((_Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                    *)&p_Var14[4]._M_parent[1]._M_parent,
                                   (key_type *)&cVar25._M_node[4]._M_parent);
                  if (sVar18 == 0) goto LAB_003d06bb;
                  p_Var6 = *(_Base_ptr *)(cVar25._M_node + 9);
                  uVar11 = (uint)CONCAT71((int7)(sVar18 >> 8),1);
                  bVar34 = true;
                  if (p_Var6 == p_Var26->_M_left) {
                    if (p_Var6 == (_Base_ptr)0x0) {
                      bVar34 = false;
                      uVar11 = 0;
                    }
                    else {
                      iVar12 = bcmp(cVar25._M_node[8]._M_right,p_Var26->_M_parent,(size_t)p_Var6);
                      bVar34 = iVar12 != 0;
                      uVar11 = CONCAT31((int3)((uint)iVar12 >> 8),bVar34);
                    }
                  }
                  uVar33 = (ulong)uVar11;
                  if (bVar34 != false) {
                    cmCMakePresetsErrors::INVALID_WORKFLOW_STEPS
                              ((string *)&p_Var26->_M_parent,pcVar1);
                  }
LAB_003d0713:
                  uVar33 = CONCAT71((int7)(uVar33 >> 8),bVar34) ^ 1;
                  break;
                case 2:
                  cVar23 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>_>
                           ::find(&local_78->_M_t,(key_type *)&p_Var16->_M_parent);
                  if (cVar23._M_node == (_Base_ptr)local_118.doc.field_2._8_8_) goto LAB_003d06ac;
                  sVar18 = std::
                           _Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           ::count((_Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                    *)&p_Var14[4]._M_parent[1]._M_parent,
                                   (key_type *)&cVar23._M_node[4]._M_parent);
                  if (sVar18 != 0) {
                    p_Var6 = *(_Base_ptr *)(cVar23._M_node + 9);
                    uVar11 = (uint)CONCAT71((int7)(sVar18 >> 8),1);
                    bVar34 = true;
                    if (p_Var6 == p_Var26->_M_left) {
                      if (p_Var6 == (_Base_ptr)0x0) {
                        uVar11 = 0;
                        bVar34 = false;
                      }
                      else {
                        iVar12 = bcmp(cVar23._M_node[8]._M_right,p_Var26->_M_parent,(size_t)p_Var6);
                        bVar34 = iVar12 != 0;
                        uVar11 = CONCAT31((int3)((uint)iVar12 >> 8),bVar34);
                      }
                    }
                    uVar33 = (ulong)uVar11;
                    if (bVar34) {
                      cmCMakePresetsErrors::INVALID_WORKFLOW_STEPS
                                ((string *)&p_Var26->_M_parent,pcVar1);
                    }
                    goto LAB_003d0713;
                  }
                  goto LAB_003d06bb;
                case 3:
                  cVar24 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>_>_>
                           ::find(&local_80->_M_t,(key_type *)&p_Var16->_M_parent);
                  if (cVar24._M_node == (_Base_ptr)local_118.doc.field_2._M_allocated_capacity)
                  goto LAB_003d06ac;
                  sVar18 = std::
                           _Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           ::count((_Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                    *)&p_Var14[4]._M_parent[1]._M_parent,
                                   (key_type *)&cVar24._M_node[4]._M_parent);
                  if (sVar18 != 0) {
                    p_Var6 = *(_Base_ptr *)(cVar24._M_node + 9);
                    uVar11 = (uint)CONCAT71((int7)(sVar18 >> 8),1);
                    bVar34 = true;
                    if (p_Var6 == p_Var26->_M_left) {
                      if (p_Var6 == (_Base_ptr)0x0) {
                        bVar34 = false;
                        uVar11 = 0;
                      }
                      else {
                        iVar12 = bcmp(cVar24._M_node[8]._M_right,p_Var26->_M_parent,(size_t)p_Var6);
                        bVar34 = iVar12 != 0;
                        uVar11 = CONCAT31((int3)((uint)iVar12 >> 8),bVar34);
                      }
                    }
                    uVar33 = (ulong)uVar11;
                    if (bVar34 != false) {
                      cmCMakePresetsErrors::INVALID_WORKFLOW_STEPS
                                ((string *)&p_Var26->_M_parent,pcVar1);
                    }
                    goto LAB_003d0713;
                  }
LAB_003d06bb:
                  cmCMakePresetsErrors::WORKFLOW_STEP_UNREACHABLE_FROM_FILE
                            ((string *)&p_Var16->_M_parent,pcVar1);
LAB_003d06c8:
                  uVar33 = 0;
                }
                uVar21 = uVar33 & 0xffffffff;
LAB_003d071a:
                uVar32 = (undefined4)uVar33;
                if ((uVar21 & 1) == 0) break;
                p_Var16 = (_Base_ptr)&p_Var16[1]._M_parent;
                bVar8 = p_Var16 == p_Var15;
              } while (!bVar8);
              bVar34 = p_Var26 == (_Base_ptr)0x0;
            }
            if (!bVar8) break;
            if (bVar34) {
              cmCMakePresetsErrors::NO_WORKFLOW_STEPS((string *)(p_Var14 + 1),pcVar1);
              break;
            }
            pp_Var3 = &p_Var14[9]._M_left;
            local_198._12_4_ = uVar32;
            std::_Optional_payload_base<cmCMakePresetsGraph::WorkflowPreset>::_M_reset
                      ((_Optional_payload_base<cmCMakePresetsGraph::WorkflowPreset> *)pp_Var3);
            WorkflowPreset::WorkflowPreset
                      ((WorkflowPreset *)pp_Var3,(WorkflowPreset *)(p_Var14 + 2));
            *(undefined1 *)&p_Var14[0x11]._M_color = _S_black;
            local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffff00000000;
            local_1c8._M_allocated_capacity = 0;
            local_1c8._8_8_ = local_1d8 + 8;
            local_1b0 = (pointer)0x0;
            p_Var27 = p_Var14 + 0xf;
            local_1b8 = (Error *)local_1c8._8_8_;
            for (p_Var19 = p_Var14[0xf]._M_left; p_Var19 != p_Var27;
                p_Var19 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var19)) {
              pmVar13 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                                      *)local_1d8,(key_type *)(p_Var19 + 1));
              *pmVar13 = Unvisited;
            }
            local_188._0_8_ = (pointer)0x0;
            local_188._8_8_ = (_Base_ptr)0x0;
            local_188._16_8_ = (Error *)0x0;
            local_208._0_8_ = operator_new(0x38);
            ((MacroExpander *)local_208._0_8_)->_vptr_MacroExpander =
                 (_func_int **)&PTR_operator___00a56870;
            ((MacroExpander *)(local_208._0_8_ + 8))->_vptr_MacroExpander = (_func_int **)this;
            *(undefined1 *)&((MacroExpander *)(local_208._0_8_ + 0x30))->_vptr_MacroExpander = 0;
            std::
            vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
            ::
            emplace_back<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>
                      ((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
                        *)local_188,
                       (unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
                        *)local_208);
            if ((MacroExpander *)local_208._0_8_ != (MacroExpander *)0x0) {
              (*(*(_func_int ***)local_208._0_8_)[2])();
            }
            local_208._0_8_ = operator_new(0x18);
            ((MacroExpander *)local_208._0_8_)->_vptr_MacroExpander =
                 (_func_int **)&PTR_operator___00a56e50;
            ((MacroExpander *)(local_208._0_8_ + 8))->_vptr_MacroExpander = (_func_int **)this;
            ((MacroExpander *)(local_208._0_8_ + 0x10))->_vptr_MacroExpander =
                 (_func_int **)(p_Var14 + 2);
            std::
            vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
            ::
            emplace_back<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>
                      ((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
                        *)local_188,
                       (unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
                        *)local_208);
            if ((MacroExpander *)local_208._0_8_ != (MacroExpander *)0x0) {
              (*(*(_func_int ***)local_208._0_8_)[2])();
            }
            local_208._0_8_ = operator_new(0x20);
            ((MacroExpander *)local_208._0_8_)->_vptr_MacroExpander =
                 (_func_int **)&PTR_operator___00a56cd0;
            ((MacroExpander *)(local_208._0_8_ + 8))->_vptr_MacroExpander = (_func_int **)local_1d8;
            ((MacroExpander *)(local_208._0_8_ + 0x10))->_vptr_MacroExpander = (_func_int **)pp_Var3
            ;
            ((MacroExpander *)(local_208._0_8_ + 0x18))->_vptr_MacroExpander =
                 (_func_int **)local_188;
            p_Var30 = (_Link_type)local_208;
            std::
            vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
            ::
            emplace_back<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>
                      ((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
                        *)local_188,
                       (unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
                        *)p_Var30);
            if ((MacroExpander *)local_208._0_8_ != (MacroExpander *)0x0) {
              (*(*(_func_int ***)local_208._0_8_)[2])();
            }
            p_Var19 = p_Var14[0xf]._M_left;
            local_228 = (ulong)p_Var14 & 0xffffffff;
            bVar8 = p_Var19 == p_Var27;
            if (!bVar8) {
              local_60 = (string *)&p_Var14[2]._M_parent;
              bVar8 = false;
              local_228 = (ulong)local_60 & 0xffffffff;
              do {
                bVar34 = true;
                if ((char)p_Var19[3]._M_color == _S_black) {
                  p_Var30 = (_Link_type)(p_Var19 + 1);
                  pmVar13 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                                          *)local_1d8,(key_type *)p_Var30);
                  EVar10 = Ok;
                  if (*pmVar13 != Verified) {
                    if (*pmVar13 == InProgress) {
                      EVar10 = Error;
                    }
                    else {
                      _Var5 = p_Var14[4]._M_parent[1]._M_color;
                      *pmVar13 = InProgress;
                      p_Var30 = (_Link_type)local_188;
                      EVar10 = cmCMakePresetsGraphInternal::ExpandMacros
                                         ((string *)(p_Var19 + 2),(MacroExpanderVector *)p_Var30,
                                          _Var5);
                      if (EVar10 == Ok) {
                        *pmVar13 = Verified;
                        EVar10 = Ok;
                      }
                    }
                  }
                  if (EVar10 == Ignore) {
                    std::_Optional_payload_base<cmCMakePresetsGraph::WorkflowPreset>::_M_reset
                              ((_Optional_payload_base<cmCMakePresetsGraph::WorkflowPreset> *)
                               pp_Var3);
                    local_228 = 1;
                    bVar34 = false;
                  }
                  else if (EVar10 == Error) {
                    p_Var30 = (_Link_type)pcVar1;
                    cmCMakePresetsErrors::INVALID_PRESET_NAMED(local_60,pcVar1);
                    bVar34 = false;
                    local_228 = 0;
                  }
                }
                if (!bVar34) break;
                p_Var19 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var19);
                bVar8 = p_Var19 == p_Var27;
              } while (!bVar8);
            }
            uVar32 = local_198._12_4_;
            if (bVar8) {
              p_Var16 = p_Var14[6]._M_left;
              if (p_Var16 != (_Base_ptr)0x0) {
                local_208[1] = 0;
                p_Var30 = (_Link_type)local_188;
                cVar9 = (**(code **)(*(long *)p_Var16 + 0x10))
                                  (p_Var16,p_Var30,p_Var14[4]._M_parent[1]._M_color);
                if (cVar9 == '\0') {
                  p_Var30 = (_Link_type)pcVar1;
                  cmCMakePresetsErrors::INVALID_PRESET_NAMED((string *)&p_Var14[2]._M_parent,pcVar1)
                  ;
                  bVar8 = false;
                  local_228 = 0;
                }
                else if (local_208[1] == _S_red >> 8) {
                  std::_Optional_payload_base<cmCMakePresetsGraph::WorkflowPreset>::_M_reset
                            ((_Optional_payload_base<cmCMakePresetsGraph::WorkflowPreset> *)pp_Var3)
                  ;
                  local_228 = 1;
                  bVar8 = false;
                }
                else {
                  *(undefined1 *)&p_Var14[0xe]._M_left = local_208[0];
                  bVar8 = true;
                }
                if (!bVar8) goto LAB_003d0a81;
              }
              std::
              vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
              ::~vector((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
                         *)local_188);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
              ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                          *)local_1c8._M_allocated_capacity,p_Var30);
            }
            else {
LAB_003d0a81:
              std::
              vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
              ::~vector((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
                         *)local_188);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
              ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                          *)local_1c8._M_allocated_capacity,p_Var30);
              if ((local_228 & 1) == 0) {
                cmCMakePresetsErrors::INVALID_MACRO_EXPANSION((string *)(p_Var14 + 1),pcVar1);
                break;
              }
            }
            p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
            bVar7 = p_Var14 == local_68;
          } while (!bVar7);
        }
        goto LAB_003d0bd5;
      }
    }
    else {
      bVar7 = true;
      if (allowNoFiles) goto LAB_003d0bd5;
      cmCMakePresetsErrors::FILE_NOT_FOUND(&local_a0,&this->parseState);
    }
  }
LAB_003d0bd3:
  bVar7 = false;
LAB_003d0bd5:
  if (local_118.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>.
      _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    operator_delete(local_118.errors.
                    super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>.
                    _M_impl.super__Vector_impl_data._M_finish,
                    (long)local_118.doc._M_dataplus._M_p -
                    (long)local_118.errors.
                          super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  return bVar7;
}

Assistant:

bool cmCMakePresetsGraph::ReadProjectPresetsInternal(bool allowNoFiles)
{
  bool haveOneFile = false;

  File* file;
  std::string filename = GetUserFilename(this->SourceDir);
  std::vector<File*> inProgressFiles;
  if (cmSystemTools::FileExists(filename)) {
    if (!this->ReadJSONFile(filename, RootType::User, ReadReason::Root,
                            inProgressFiles, file, this->errors)) {
      return false;
    }
    haveOneFile = true;
  } else {
    filename = GetFilename(this->SourceDir);
    if (cmSystemTools::FileExists(filename)) {
      if (!this->ReadJSONFile(filename, RootType::Project, ReadReason::Root,
                              inProgressFiles, file, this->errors)) {
        return false;
      }
      haveOneFile = true;
    }
  }
  assert(inProgressFiles.empty());

  if (!haveOneFile) {
    if (allowNoFiles) {
      return true;
    }
    cmCMakePresetsErrors::FILE_NOT_FOUND(filename, &this->parseState);
    return false;
  }

  bool result = ComputePresetInheritance(this->ConfigurePresets, *this) &&
    ComputePresetInheritance(this->ConfigurePresets, *this) &&
    ComputePresetInheritance(this->BuildPresets, *this) &&
    ComputePresetInheritance(this->TestPresets, *this) &&
    ComputePresetInheritance(this->PackagePresets, *this) &&
    ComputePresetInheritance(this->WorkflowPresets, *this);
  if (!result) {
    return false;
  }

  for (auto& it : this->ConfigurePresets) {
    if (!ExpandMacros(*this, it.second.Unexpanded, it.second.Expanded)) {
      cmCMakePresetsErrors::INVALID_MACRO_EXPANSION(it.first,
                                                    &this->parseState);
      return false;
    }
  }

  for (auto& it : this->BuildPresets) {
    if (!it.second.Unexpanded.Hidden) {
      const auto configurePreset =
        this->ConfigurePresets.find(it.second.Unexpanded.ConfigurePreset);
      if (configurePreset == this->ConfigurePresets.end()) {
        cmCMakePresetsErrors::INVALID_CONFIGURE_PRESET(it.first,
                                                       &this->parseState);
        return false;
      }
      if (!it.second.Unexpanded.OriginFile->ReachableFiles.count(
            configurePreset->second.Unexpanded.OriginFile)) {
        cmCMakePresetsErrors::CONFIGURE_PRESET_UNREACHABLE_FROM_FILE(
          it.first, &this->parseState);
        return false;
      }

      if (it.second.Unexpanded.InheritConfigureEnvironment.value_or(true)) {
        it.second.Unexpanded.Environment.insert(
          configurePreset->second.Unexpanded.Environment.begin(),
          configurePreset->second.Unexpanded.Environment.end());
      }
    }

    if (!ExpandMacros(*this, it.second.Unexpanded, it.second.Expanded)) {
      cmCMakePresetsErrors::INVALID_MACRO_EXPANSION(it.first,
                                                    &this->parseState);
      return false;
    }
  }

  for (auto& it : this->TestPresets) {
    if (!it.second.Unexpanded.Hidden) {
      const auto configurePreset =
        this->ConfigurePresets.find(it.second.Unexpanded.ConfigurePreset);
      if (configurePreset == this->ConfigurePresets.end()) {
        cmCMakePresetsErrors::INVALID_CONFIGURE_PRESET(it.first,
                                                       &this->parseState);
        return false;
      }
      if (!it.second.Unexpanded.OriginFile->ReachableFiles.count(
            configurePreset->second.Unexpanded.OriginFile)) {
        cmCMakePresetsErrors::CONFIGURE_PRESET_UNREACHABLE_FROM_FILE(
          it.first, &this->parseState);
        return false;
      }

      if (it.second.Unexpanded.InheritConfigureEnvironment.value_or(true)) {
        it.second.Unexpanded.Environment.insert(
          configurePreset->second.Unexpanded.Environment.begin(),
          configurePreset->second.Unexpanded.Environment.end());
      }
    }

    if (!ExpandMacros(*this, it.second.Unexpanded, it.second.Expanded)) {
      cmCMakePresetsErrors::INVALID_MACRO_EXPANSION(it.first,
                                                    &this->parseState);
      return false;
    }
  }

  for (auto& it : this->PackagePresets) {
    if (!it.second.Unexpanded.Hidden) {
      const auto configurePreset =
        this->ConfigurePresets.find(it.second.Unexpanded.ConfigurePreset);
      if (configurePreset == this->ConfigurePresets.end()) {
        cmCMakePresetsErrors::INVALID_CONFIGURE_PRESET(it.first,
                                                       &this->parseState);
        return false;
      }
      if (!it.second.Unexpanded.OriginFile->ReachableFiles.count(
            configurePreset->second.Unexpanded.OriginFile)) {
        cmCMakePresetsErrors::CONFIGURE_PRESET_UNREACHABLE_FROM_FILE(
          it.first, &this->parseState);
        return false;
      }

      if (it.second.Unexpanded.InheritConfigureEnvironment.value_or(true)) {
        it.second.Unexpanded.Environment.insert(
          configurePreset->second.Unexpanded.Environment.begin(),
          configurePreset->second.Unexpanded.Environment.end());
      }
    }

    if (!ExpandMacros(*this, it.second.Unexpanded, it.second.Expanded)) {
      cmCMakePresetsErrors::INVALID_MACRO_EXPANSION(it.first,
                                                    &this->parseState);
      return false;
    }
  }

  for (auto& it : this->WorkflowPresets) {
    using Type = WorkflowPreset::WorkflowStep::Type;

    const ConfigurePreset* configurePreset = nullptr;
    for (auto const& step : it.second.Unexpanded.Steps) {
      if (configurePreset == nullptr && step.PresetType != Type::Configure) {
        cmCMakePresetsErrors::FIRST_WORKFLOW_STEP_NOT_CONFIGURE(
          step.PresetName, &this->parseState);
        return false;
      }
      if (configurePreset != nullptr && step.PresetType == Type::Configure) {
        cmCMakePresetsErrors::CONFIGURE_WORKFLOW_STEP_NOT_FIRST(
          step.PresetName, &this->parseState);
        return false;
      }

      switch (step.PresetType) {
        case Type::Configure:
          result = TryReachPresetFromWorkflow(
            it.second.Unexpanded, this->ConfigurePresets, step.PresetName,
            configurePreset, &this->parseState);
          break;
        case Type::Build:
          result = TryReachPresetFromWorkflow(
            it.second.Unexpanded, this->BuildPresets, step.PresetName,
            configurePreset, &this->parseState);
          break;
        case Type::Test:
          result = TryReachPresetFromWorkflow(
            it.second.Unexpanded, this->TestPresets, step.PresetName,
            configurePreset, &this->parseState);
          break;
        case Type::Package:
          result = TryReachPresetFromWorkflow(
            it.second.Unexpanded, this->PackagePresets, step.PresetName,
            configurePreset, &this->parseState);
          break;
      }
      if (!result) {
        return false;
      }
    }

    if (configurePreset == nullptr) {
      cmCMakePresetsErrors::NO_WORKFLOW_STEPS(it.first, &this->parseState);
      return false;
    }

    if (!ExpandMacros(*this, it.second.Unexpanded, it.second.Expanded)) {
      cmCMakePresetsErrors::INVALID_MACRO_EXPANSION(it.first,
                                                    &this->parseState);
      return false;
    }
  }

  return true;
}